

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.cc
# Opt level: O0

void cnn::TensorTools::Constant(Tensor *d,float c)

{
  void *__s;
  uint uVar1;
  long in_RDI;
  float in_XMM0_Da;
  float *__last;
  Dim *in_stack_ffffffffffffffe0;
  Dim *this;
  
  if ((in_XMM0_Da != 0.0) || (NAN(in_XMM0_Da))) {
    this = *(Dim **)(in_RDI + 0x28);
    __last = *(float **)(in_RDI + 0x28);
    Dim::size(this);
    std::fill<float*,float>((float *)this,__last,(float *)0x5108c1);
  }
  else {
    __s = *(void **)(in_RDI + 0x28);
    uVar1 = Dim::size(in_stack_ffffffffffffffe0);
    memset(__s,(int)in_XMM0_Da & 0xff,(ulong)uVar1 << 2);
  }
  return;
}

Assistant:

void TensorTools::Constant(Tensor& d, float c) {
#if HAVE_CUDA
  if (!c) {
    CUDA_CHECK(cudaMemsetAsync(d.v, 0, d.d.size() * sizeof(float)));
  } else {
    fill(d.v, d.v + d.d.size(), c);
  }
#else
  if (!c) {
    memset(d.v, c, d.d.size() * sizeof(float));
  } else {
    fill(d.v, d.v + d.d.size(), c);
  }
#endif
}